

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

Parameters *
vkt::api::anon_unknown_1::PipelineLayout::Parameters::singleDescriptorSet
          (Parameters *__return_storage_ptr__,Parameters *descriptorSetLayout)

{
  pointer this;
  pointer pPVar1;
  pointer pPVar2;
  ulong uVar3;
  pointer pPVar4;
  pointer pPVar5;
  ulong uVar6;
  _Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
  *this_00;
  long lVar7;
  pointer pPVar8;
  
  (__return_storage_ptr__->descriptorSetLayouts).
  super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->descriptorSetLayouts).
  super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->descriptorSetLayouts).
  super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->pushConstantRanges).
  super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->pushConstantRanges).
  super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->pushConstantRanges).
  super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = (__return_storage_ptr__->descriptorSetLayouts).
         super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  pPVar1 = (__return_storage_ptr__->descriptorSetLayouts).
           super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (this == pPVar1) {
    pPVar2 = (__return_storage_ptr__->descriptorSetLayouts).
             super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar7 = (long)this - (long)pPVar2;
    if (lVar7 == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar6 = (lVar7 >> 3) * -0x5555555555555555;
    uVar3 = 1;
    if (this != pPVar2) {
      uVar3 = uVar6;
    }
    this_00 = (_Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
               *)(uVar3 + uVar6);
    if ((_Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
         *)0x555555555555554 < this_00) {
      this_00 = (_Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
                 *)0x555555555555555;
    }
    if (CARRY8(uVar3,uVar6)) {
      this_00 = (_Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
                 *)0x555555555555555;
    }
    pPVar4 = std::
             _Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
             ::_M_allocate(this_00,(size_t)descriptorSetLayout);
    std::
    vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
    ::vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
              *)(lVar7 + (long)pPVar4),&descriptorSetLayout->bindings);
    pPVar8 = pPVar4;
    for (pPVar5 = pPVar2; this != pPVar5; pPVar5 = pPVar5 + 1) {
      (pPVar8->bindings).
      super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pPVar5->bindings).
           super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pPVar8->bindings).
      super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pPVar5->bindings).
           super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (pPVar8->bindings).
      super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pPVar5->bindings).
           super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pPVar5->bindings).
      super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pPVar5->bindings).
      super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pPVar5->bindings).
      super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pPVar8 = pPVar8 + 1;
    }
    if (pPVar2 != (pointer)0x0) {
      operator_delete(pPVar2,(long)pPVar1 - (long)pPVar2);
    }
    (__return_storage_ptr__->descriptorSetLayouts).
    super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
    ._M_impl.super__Vector_impl_data._M_start = pPVar4;
    (__return_storage_ptr__->descriptorSetLayouts).
    super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
    ._M_impl.super__Vector_impl_data._M_finish = pPVar8 + 1;
    (__return_storage_ptr__->descriptorSetLayouts).
    super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar4 + (long)this_00;
  }
  else {
    std::
    vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
    ::vector(&this->bindings,&descriptorSetLayout->bindings);
    (__return_storage_ptr__->descriptorSetLayouts).
    super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
    ._M_impl.super__Vector_impl_data._M_finish = this + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

static Parameters singleDescriptorSet (const DescriptorSetLayout::Parameters& descriptorSetLayout)
		{
			Parameters params;
			params.descriptorSetLayouts.push_back(descriptorSetLayout);
			return params;
		}